

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

bool __thiscall clipp::parser::try_match_blocked(parser *this,arg_string *arg)

{
  bool bVar1;
  parser ahead;
  parser local_118;
  
  if ((this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_118.root_ = this->root_;
    detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_118.pos_,&this->pos_);
    local_118.index_ = this->index_;
    local_118.eaten_ = this->eaten_;
    std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::vector
              (&local_118.args_,&this->args_);
    std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
    vector(&local_118.missCand_,&this->missCand_);
    local_118.blocked_ = this->blocked_;
    bVar1 = try_match_blocked(this,&local_118,arg);
    std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
    ~vector(&local_118.missCand_);
    std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::~vector
              (&local_118.args_);
    std::
    _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
    ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                    *)&local_118.pos_.scopes_);
    if (local_118.pos_.posAfterLastMatch_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.pos_.posAfterLastMatch_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.pos_.posAfterLastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.pos_.posAfterLastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_118.pos_.lastMatch_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.pos_.lastMatch_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.pos_.lastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.pos_.lastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_118.pos_.pos_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.pos_.pos_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.pos_.pos_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.pos_.pos_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar1) {
      return true;
    }
  }
  if (this->root_ != (group *)0x0) {
    parser(&local_118,this->root_,this->index_ + 1);
    bVar1 = try_match_blocked(this,&local_118,arg);
    std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
    ~vector(&local_118.missCand_);
    std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::~vector
              (&local_118.args_);
    std::
    _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
    ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                    *)&local_118.pos_.scopes_);
    if (local_118.pos_.posAfterLastMatch_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.pos_.posAfterLastMatch_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.pos_.posAfterLastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.pos_.posAfterLastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_118.pos_.lastMatch_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.pos_.lastMatch_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.pos_.lastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.pos_.lastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_118.pos_.pos_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.pos_.pos_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.pos_.pos_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.pos_.pos_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool try_match_blocked(const arg_string& arg)
    {
        //try to match ahead (using temporary parser)
        if(pos_) {
            auto ahead = *this;
            if(try_match_blocked(std::move(ahead), arg)) return true;
        }

        //try to match from the beginning (using temporary parser)
        if(root_) {
            parser all{*root_, index_+1};
            if(try_match_blocked(std::move(all), arg)) return true;
        }

        return false;
    }